

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O3

void BuilderTests<GrpcLikeMessageBuilder,_GrpcLikeMessageBuilder>::builder_swap_after_finish_test
               (bool run)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint val;
  Allocator *pAVar2;
  uint val_00;
  bool bVar3;
  Offset<MyGame::Example::Monster> OVar4;
  undefined7 in_register_00000039;
  GrpcLikeMessageBuilder dst;
  GrpcLikeMessageBuilder src;
  string local_158;
  Allocator local_138;
  FlatBufferBuilder local_130;
  Allocator local_b0;
  FlatBufferBuilder local_a8;
  
  if ((int)CONCAT71(in_register_00000039,run) != 0) {
    local_b0._vptr_Allocator = (_func_int **)&PTR__Allocator_001fad28;
    local_a8.buf_.allocator_ = &local_b0;
    local_a8.buf_.own_allocator_ = false;
    local_a8.buf_.initial_size_ = 0x400;
    local_a8.buf_.max_size_ = 0x7fffffff;
    local_a8.buf_.buffer_minalign_ = 8;
    local_a8.buf_.reserved_ = 0;
    local_a8.buf_.size_ = 0;
    local_a8.length_of_64_bit_region_ = 0;
    local_a8.nested = false;
    local_a8.finished = false;
    local_a8.buf_.buf_ = (uint8_t *)0x0;
    local_a8.buf_.cur_._0_6_ = 0;
    local_a8.buf_.cur_._6_2_ = 0;
    local_a8.buf_.scratch_._0_6_ = 0;
    local_a8._78_8_ = 0;
    local_a8.minalign_ = 1;
    local_a8.force_defaults_ = false;
    local_a8.dedup_vtables_ = true;
    local_a8.string_pool = (StringOffsetMap *)0x0;
    OVar4 = populate1(&local_a8);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish(&local_a8,OVar4.o,(char *)0x0,false);
    val_00 = local_a8.buf_.size_;
    local_138._vptr_Allocator = (_func_int **)&PTR__Allocator_001fad28;
    local_130.buf_.allocator_ = &local_138;
    local_130.buf_.own_allocator_ = false;
    local_130.buf_.initial_size_ = 0x400;
    local_130.buf_.max_size_ = 0x7fffffff;
    local_130.buf_.buffer_minalign_ = 8;
    local_130.buf_.reserved_ = 0;
    local_130.buf_.size_ = 0;
    local_130.length_of_64_bit_region_ = 0;
    local_130.nested = false;
    local_130.finished = false;
    local_130.buf_.buf_ = (uint8_t *)0x0;
    local_130.buf_.cur_._0_6_ = 0;
    local_130.buf_.cur_._6_2_ = 0;
    local_130.buf_.scratch_._0_6_ = 0;
    local_130._78_8_ = 0;
    local_130.minalign_ = 1;
    local_130.force_defaults_ = false;
    local_130.dedup_vtables_ = true;
    local_130.string_pool = (StringOffsetMap *)0x0;
    OVar4 = populate2(&local_130);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish(&local_130,OVar4.o,(char *)0x0,false);
    val = local_130.buf_.size_;
    flatbuffers::FlatBufferBuilderImpl<false>::Swap(&local_a8,&local_130);
    bVar3 = local_a8.buf_.own_allocator_;
    pAVar2 = local_a8.buf_.allocator_;
    local_a8.buf_.allocator_ = local_130.buf_.allocator_;
    local_130.buf_.allocator_ = pAVar2;
    local_a8.buf_.own_allocator_ = local_130.buf_.own_allocator_;
    local_130.buf_.own_allocator_ = bVar3;
    TestEq<unsigned_int,unsigned_int>
              (local_a8.buf_.size_,val,"\'src.GetSize()\' != \'size2\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
               ,0xc5,
               "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
              );
    TestEq<unsigned_int,unsigned_int>
              (local_130.buf_.size_,val_00,"\'dst.GetSize()\' != \'size1\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
               ,0xc6,
               "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
              );
    paVar1 = &local_158.field_2;
    local_158.field_2._M_allocated_capacity._0_4_ = 0x706d49;
    local_158._M_string_length = 3;
    local_158._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = release_n_verify(&local_a8,&local_158,Color_Green);
    TestEq<bool,bool>(true,bVar3,"\'true\' != \'release_n_verify(src, m2_name(), m2_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,199,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    local_158.field_2._M_allocated_capacity = 0x6d65647265627943;
    local_158.field_2._8_2_ = 0x6e6f;
    local_158._M_string_length = 10;
    local_158.field_2._M_local_buf[10] = '\0';
    local_158._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = release_n_verify(&local_130,&local_158,Color_Red);
    TestEq<bool,bool>(true,bVar3,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,200,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_130);
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_a8);
  }
  return;
}

Assistant:

static void builder_swap_after_finish_test(
      bool run = std::is_same<DestBuilder, SrcBuilder>::value) {
    /// Swap is allowed only when lhs and rhs are the same concrete type.
    if (run) {
      SrcBuilder src;
      auto root_offset1 = populate1(src);
      src.Finish(root_offset1);
      auto size1 = src.GetSize();
      DestBuilder dst;
      auto root_offset2 = populate2(dst);
      dst.Finish(root_offset2);
      auto size2 = dst.GetSize();
      src.Swap(dst);
      TEST_EQ_FUNC(src.GetSize(), size2);
      TEST_EQ_FUNC(dst.GetSize(), size1);
      TEST_ASSERT_FUNC(release_n_verify(src, m2_name(), m2_color()));
      TEST_ASSERT_FUNC(release_n_verify(dst, m1_name(), m1_color()));
    }
  }